

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QRegion __thiscall QTreeView::visualRegionForSelection(QTreeView *this,QItemSelection *selection)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  RectRule RVar7;
  QTreeViewPrivate *pQVar8;
  QTreeViewPrivate *this_00;
  ulong uVar9;
  long *in_RSI;
  QRegionData *in_RDI;
  long in_FS_OFFSET;
  int c;
  int height;
  int columnCount;
  QItemSelectionRange *range;
  QItemSelection *__range1;
  QRect *viewportRect;
  QTreeViewPrivate *d;
  QRegion *selectionRegion;
  QRect combined;
  QRect rangeRect;
  int bottom;
  QRect rightRect;
  QModelIndex rightIndex;
  int top;
  QRect leftRect;
  QModelIndex leftIndex;
  QModelIndex parent;
  const_iterator __end1;
  const_iterator __begin1;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  byte local_191;
  RectRule in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  undefined1 local_124 [16];
  undefined1 *local_114;
  undefined1 *local_10c;
  int local_104;
  undefined1 local_100 [16];
  QPersistentModelIndexData *local_f0;
  undefined1 *local_e8;
  QAbstractItemModel *local_e0;
  QPersistentModelIndexData *local_d8;
  undefined1 *local_d0;
  QAbstractItemModel *local_c8;
  QModelIndex local_c0;
  int local_a4;
  undefined1 local_a0 [16];
  QPersistentModelIndexData *local_90;
  undefined1 *local_88;
  QAbstractItemModel *local_80;
  QPersistentModelIndexData *local_78;
  undefined1 *local_70;
  QAbstractItemModel *local_68;
  QModelIndex local_60;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QItemSelectionRange *local_30;
  const_iterator local_28;
  const_iterator local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = d_func((QTreeView *)0x8fd403);
  bVar2 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x8fd418);
  if (bVar2) {
    QRegion::QRegion((QRegion *)in_RDI);
  }
  else {
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)in_RDI);
    local_18 = QWidget::rect((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_20.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = QList<QItemSelectionRange>::begin
                         ((QList<QItemSelectionRange> *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    local_28.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QItemSelectionRange>::end
                         ((QList<QItemSelectionRange> *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    while( true ) {
      local_30 = local_28.i;
      bVar2 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_20,local_28);
      if (!bVar2) break;
      this_00 = (QTreeViewPrivate *)QList<QItemSelectionRange>::const_iterator::operator*(&local_20)
      ;
      bVar2 = QItemSelectionRange::isValid
                        ((QItemSelectionRange *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      if (bVar2) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        QItemSelectionRange::parent
                  ((QItemSelectionRange *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_60.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        local_60.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        QItemSelectionRange::topLeft((QItemSelectionRange *)this_00);
        QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_60);
        pQVar1 = (pQVar8->super_QAbstractItemViewPrivate).model;
        iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_48);
        while( true ) {
          bVar2 = QModelIndex::isValid
                            ((QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          local_191 = 0;
          if (bVar2) {
            local_191 = (**(code **)(*in_RSI + 0x2c0))(in_RSI,&local_60);
          }
          if ((local_191 & 1) == 0) break;
          iVar6 = QModelIndex::column(&local_60);
          if (iVar6 + 1 < iVar4) {
            pQVar1 = (pQVar8->super_QAbstractItemViewPrivate).model;
            iVar6 = QModelIndex::row(&local_60);
            iVar5 = QModelIndex::column(&local_60);
            (**(code **)(*(long *)pQVar1 + 0x60))(&local_78,pQVar1,iVar6,iVar5 + 1,&local_48);
            local_60._0_8_ = local_78;
            local_60.i = (quintptr)local_70;
            local_60.m.ptr = local_68;
          }
          else {
            QModelIndex::QModelIndex((QModelIndex *)0x8fd6e2);
            local_60._0_8_ = local_90;
            local_60.i = (quintptr)local_88;
            local_60.m.ptr = local_80;
          }
        }
        bVar2 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        if (bVar2) {
          local_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a0 = (undefined1  [16])
                     QTreeViewPrivate::visualRect
                               (this_00,(QModelIndex *)CONCAT44(iVar4,in_stack_fffffffffffffe90),
                                in_stack_fffffffffffffe8c);
          local_a4 = QRect::top((QRect *)0x8fd782);
          local_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_c0.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          local_c0.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          QItemSelectionRange::bottomRight((QItemSelectionRange *)this_00);
          QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_c0);
          while( true ) {
            bVar2 = QModelIndex::isValid
                              ((QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            in_stack_fffffffffffffe5c = in_stack_fffffffffffffe5c & 0xffffff;
            if (bVar2) {
              uVar3 = (**(code **)(*in_RSI + 0x2c0))(in_RSI,&local_c0);
              in_stack_fffffffffffffe5c = CONCAT13(uVar3,(int3)in_stack_fffffffffffffe5c);
            }
            if ((in_stack_fffffffffffffe5c & 0x1000000) == 0) break;
            iVar6 = QModelIndex::column(&local_c0);
            if (iVar6 + -1 < 0) {
              QModelIndex::QModelIndex((QModelIndex *)0x8fd8c1);
              local_c0._0_8_ = local_f0;
              local_c0.i = (quintptr)local_e8;
              local_c0.m.ptr = local_e0;
            }
            else {
              pQVar1 = (pQVar8->super_QAbstractItemViewPrivate).model;
              in_stack_fffffffffffffe58 = QModelIndex::row(&local_c0);
              iVar6 = QModelIndex::column(&local_c0);
              (**(code **)(*(long *)pQVar1 + 0x60))
                        (&local_d8,pQVar1,in_stack_fffffffffffffe58,iVar6 + -1,&local_48);
              local_c0._0_8_ = local_d8;
              local_c0.i = (quintptr)local_d0;
              local_c0.m.ptr = local_c8;
            }
          }
          bVar2 = QModelIndex::isValid
                            ((QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          if (bVar2) {
            local_100._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_100._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_100 = (undefined1  [16])
                        QTreeViewPrivate::visualRect
                                  (this_00,(QModelIndex *)CONCAT44(iVar4,in_stack_fffffffffffffe90),
                                   in_stack_fffffffffffffe8c);
            local_104 = QRect::bottom((QRect *)0x8fd961);
            if (local_104 < local_a4) {
              qSwap<int>((int *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
            }
            in_stack_fffffffffffffe90 = (local_104 - local_a4) + 1;
            bVar2 = QHeaderView::sectionsMoved
                              ((QHeaderView *)
                               CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            if (bVar2) {
              RVar7 = QItemSelectionRange::left((QItemSelectionRange *)0x8fd9c9);
              while( true ) {
                in_stack_fffffffffffffe8c = RVar7;
                iVar4 = QItemSelectionRange::right((QItemSelectionRange *)0x8fd9df);
                if (iVar4 < (int)RVar7) break;
                local_114 = &DAT_aaaaaaaaaaaaaaaa;
                local_10c = &DAT_aaaaaaaaaaaaaaaa;
                in_stack_fffffffffffffe44 =
                     columnViewportPosition
                               ((QTreeView *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                in_stack_fffffffffffffe3c);
                iVar4 = local_a4;
                columnWidth((QTreeView *)
                            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            in_stack_fffffffffffffe3c);
                QRect::QRect((QRect *)CONCAT44(RVar7,iVar4),in_stack_fffffffffffffe44,
                             in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                             in_stack_fffffffffffffe38);
                uVar9 = QRect::intersects((QRect *)&local_18);
                if ((uVar9 & 1) != 0) {
                  QRegion::operator+=((QRegion *)in_RDI,(QRect *)&local_114);
                }
                RVar7 = in_stack_fffffffffffffe8c + SingleSection;
              }
            }
            else {
              local_124._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_124._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_124 = QRect::operator|((QRect *)local_a0,(QRect *)local_100);
              bVar2 = QWidget::isRightToLeft((QWidget *)0x8fdae0);
              if (bVar2) {
                in_stack_fffffffffffffe40 =
                     QItemSelectionRange::right((QItemSelectionRange *)0x8fdaf0);
              }
              else {
                in_stack_fffffffffffffe40 =
                     QItemSelectionRange::left((QItemSelectionRange *)0x8fdb00);
              }
              columnViewportPosition
                        ((QTreeView *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         in_stack_fffffffffffffe3c);
              QRect::setX((QRect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe3c);
              uVar9 = QRect::intersects((QRect *)&local_18);
              if ((uVar9 & 1) != 0) {
                QRegion::operator+=((QRegion *)in_RDI,(QRect *)local_124);
              }
            }
          }
        }
      }
      QList<QItemSelectionRange>::const_iterator::operator++(&local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRegion)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QTreeView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QTreeView);
    if (selection.isEmpty())
        return QRegion();

    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    for (const auto &range : selection) {
        if (!range.isValid())
            continue;
        QModelIndex parent = range.parent();
        QModelIndex leftIndex = range.topLeft();
        int columnCount = d->model->columnCount(parent);
        while (leftIndex.isValid() && isIndexHidden(leftIndex)) {
            if (leftIndex.column() + 1 < columnCount)
                leftIndex = d->model->index(leftIndex.row(), leftIndex.column() + 1, parent);
            else
                leftIndex = QModelIndex();
        }
        if (!leftIndex.isValid())
            continue;
        const QRect leftRect = d->visualRect(leftIndex, QTreeViewPrivate::SingleSection);
        int top = leftRect.top();
        QModelIndex rightIndex = range.bottomRight();
        while (rightIndex.isValid() && isIndexHidden(rightIndex)) {
            if (rightIndex.column() - 1 >= 0)
                rightIndex = d->model->index(rightIndex.row(), rightIndex.column() - 1, parent);
            else
                rightIndex = QModelIndex();
        }
        if (!rightIndex.isValid())
            continue;
        const QRect rightRect = d->visualRect(rightIndex, QTreeViewPrivate::SingleSection);
        int bottom = rightRect.bottom();
        if (top > bottom)
            qSwap<int>(top, bottom);
        int height = bottom - top + 1;
        if (d->header->sectionsMoved()) {
            for (int c = range.left(); c <= range.right(); ++c) {
                const QRect rangeRect(columnViewportPosition(c), top, columnWidth(c), height);
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        } else {
            QRect combined = leftRect|rightRect;
            combined.setX(columnViewportPosition(isRightToLeft() ? range.right() : range.left()));
            if (viewportRect.intersects(combined))
                selectionRegion += combined;
        }
    }
    return selectionRegion;
}